

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

int64_t __thiscall flexbuffers::Reference::AsInt64(Reference *this)

{
  uint8_t *data;
  size_t sVar1;
  size_t *psVar2;
  byte bVar3;
  uint8_t byte_width;
  double dVar4;
  Vector local_28;
  
  sVar1 = 0;
  switch(this->type_) {
  case FBT_UINT:
    psVar2 = (size_t *)this->data_;
    bVar3 = this->parent_width_;
    goto LAB_0013d61b;
  case FBT_FLOAT:
    data = this->data_;
    byte_width = this->parent_width_;
    goto LAB_0013d5c4;
  case FBT_KEY:
  case FBT_MAP:
    break;
  case FBT_STRING:
    AsString((String *)&local_28,this);
    sVar1 = flatbuffers::StringToInt((char *)local_28.super_Sized.super_Object.data_,10);
    break;
  case FBT_INDIRECT_INT:
    psVar2 = (size_t *)Indirect(this);
    bVar3 = this->byte_width_;
LAB_0013d5db:
    if (bVar3 < 4) {
      if (bVar3 < 2) {
        sVar1 = (long)(char)(byte)*psVar2;
      }
      else {
        sVar1 = (long)(short)(ushort)*psVar2;
      }
    }
    else if (bVar3 < 8) {
      sVar1 = (long)(int)(uint)*psVar2;
    }
    else {
LAB_0013d633:
      sVar1 = *psVar2;
    }
    break;
  case FBT_INDIRECT_UINT:
    psVar2 = (size_t *)Indirect(this);
    bVar3 = this->byte_width_;
LAB_0013d61b:
    if (bVar3 < 4) {
      if (bVar3 < 2) {
        return (ulong)(byte)*psVar2;
      }
      return (ulong)(ushort)*psVar2;
    }
    if (bVar3 < 8) {
      return (ulong)(uint)*psVar2;
    }
    goto LAB_0013d633;
  case FBT_INDIRECT_FLOAT:
    data = Indirect(this);
    byte_width = this->byte_width_;
LAB_0013d5c4:
    dVar4 = ReadSizedScalar<double,signed_char,short,float,double>(data,byte_width);
    sVar1 = (size_t)dVar4;
    break;
  case FBT_VECTOR:
    AsVector(&local_28,this);
    sVar1 = local_28.super_Sized.size_;
    break;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0;
    }
  case FBT_INT:
    psVar2 = (size_t *)this->data_;
    bVar3 = this->parent_width_;
    goto LAB_0013d5db;
  }
  return sVar1;
}

Assistant:

int64_t AsInt64() const {
    if (type_ == FBT_INT) {
      // A fast path for the common case.
      return ReadInt64(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_INT: return ReadInt64(Indirect(), byte_width_);
        case FBT_UINT: return ReadUInt64(data_, parent_width_);
        case FBT_INDIRECT_UINT: return ReadUInt64(Indirect(), byte_width_);
        case FBT_FLOAT:
          return static_cast<int64_t>(ReadDouble(data_, parent_width_));
        case FBT_INDIRECT_FLOAT:
          return static_cast<int64_t>(ReadDouble(Indirect(), byte_width_));
        case FBT_NULL: return 0;
        case FBT_STRING: return flatbuffers::StringToInt(AsString().c_str());
        case FBT_VECTOR: return static_cast<int64_t>(AsVector().size());
        case FBT_BOOL: return ReadInt64(data_, parent_width_);
        default:
          // Convert other things to int.
          return 0;
      }
  }